

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pasteboard.c
# Opt level: O3

wpe_pasteboard * wpe_pasteboard_get_singleton(void)

{
  wpe_pasteboard *pwVar1;
  wpe_pasteboard_interface *pwVar2;
  void *pvVar3;
  
  pwVar1 = wpe_pasteboard_get_singleton::s_pasteboard;
  if (wpe_pasteboard_get_singleton::s_pasteboard == (wpe_pasteboard *)0x0) {
    pwVar1 = (wpe_pasteboard *)calloc(1,0x10);
    if (pwVar1 == (wpe_pasteboard *)0x0) {
      wpe_alloc_fail("/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/pasteboard.c"
                     ,0x47,0x10);
    }
    wpe_pasteboard_get_singleton::s_pasteboard = pwVar1;
    pwVar2 = (wpe_pasteboard_interface *)wpe_load_object("_wpe_pasteboard_interface");
    pwVar1 = wpe_pasteboard_get_singleton::s_pasteboard;
    if (pwVar2 == (wpe_pasteboard_interface *)0x0) {
      pwVar2 = &generic_pasteboard_interface;
    }
    wpe_pasteboard_get_singleton::s_pasteboard->interface = pwVar2;
    pvVar3 = (*pwVar2->initialize)(pwVar1);
    pwVar1 = wpe_pasteboard_get_singleton::s_pasteboard;
    wpe_pasteboard_get_singleton::s_pasteboard->interface_data = pvVar3;
  }
  return pwVar1;
}

Assistant:

struct wpe_pasteboard*
wpe_pasteboard_get_singleton()
{
    static struct wpe_pasteboard* s_pasteboard = 0;
    if (!s_pasteboard) {
        s_pasteboard = wpe_calloc(1, sizeof(struct wpe_pasteboard));
        s_pasteboard->interface = wpe_load_object("_wpe_pasteboard_interface");
        if (!s_pasteboard->interface)
            s_pasteboard->interface = &generic_pasteboard_interface;
        s_pasteboard->interface_data = s_pasteboard->interface->initialize(s_pasteboard);
    }

    return s_pasteboard;
}